

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

const_iterator * __thiscall
pstack::Dwarf::DIE::Children::begin(const_iterator *__return_storage_ptr__,Children *this)

{
  DIE local_40;
  Children *local_18;
  Children *this_local;
  
  local_18 = this;
  this_local = (Children *)__return_storage_ptr__;
  firstChild(&local_40,this->parent);
  const_iterator::const_iterator(__return_storage_ptr__,&local_40,this->parent);
  ~DIE(&local_40);
  return __return_storage_ptr__;
}

Assistant:

DIE::Children::const_iterator
DIE::Children::begin() const {
    return const_iterator(parent.firstChild(), parent);
}